

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

void __thiscall
ON_FontGlyphCache::SetFontMetrics(ON_FontGlyphCache *this,ON_FontMetrics *font_unit_metrics)

{
  ON_FontMetrics *font_metrics;
  double dVar1;
  double dVar2;
  ON__UINT_PTR OVar3;
  int iVar4;
  int iVar5;
  ON__UINT16 OVar6;
  ON__UINT16 OVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ON_FontMetrics local_48;
  
  font_metrics = &this->m_font_unit_metrics;
  iVar11 = font_unit_metrics->m_UPM;
  iVar12 = font_unit_metrics->m_ascent;
  iVar13 = font_unit_metrics->m_descent;
  iVar14 = font_unit_metrics->m_line_space;
  OVar6 = font_unit_metrics->m_ascent_of_capital;
  OVar7 = font_unit_metrics->m_ascent_of_x;
  iVar8 = font_unit_metrics->m_strikeout_thickness;
  iVar9 = font_unit_metrics->m_strikeout_position;
  iVar10 = font_unit_metrics->m_underscore_thickness;
  iVar4 = font_unit_metrics->m_underscore_position;
  iVar5 = font_unit_metrics->m_reserved1;
  dVar1 = font_unit_metrics->m_reserved2;
  OVar3 = font_unit_metrics->m_reserved_ptr;
  (this->m_font_unit_metrics).m_reserved3 = font_unit_metrics->m_reserved3;
  (this->m_font_unit_metrics).m_reserved_ptr = OVar3;
  (this->m_font_unit_metrics).m_underscore_position = iVar4;
  (this->m_font_unit_metrics).m_reserved1 = iVar5;
  (this->m_font_unit_metrics).m_reserved2 = dVar1;
  (this->m_font_unit_metrics).m_ascent_of_capital = OVar6;
  (this->m_font_unit_metrics).m_ascent_of_x = OVar7;
  (this->m_font_unit_metrics).m_strikeout_thickness = iVar8;
  (this->m_font_unit_metrics).m_strikeout_position = iVar9;
  (this->m_font_unit_metrics).m_underscore_thickness = iVar10;
  (this->m_font_unit_metrics).m_UPM = iVar11;
  (this->m_font_unit_metrics).m_ascent = iVar12;
  (this->m_font_unit_metrics).m_descent = iVar13;
  (this->m_font_unit_metrics).m_line_space = iVar14;
  if (font_unit_metrics->m_UPM < 1) {
    this->m_normalized_to_font_unit_scale = 0.0;
LAB_00473a2e:
    this->m_font_unit_to_normalized_scale = 0.0;
  }
  else {
    dVar2 = (double)font_unit_metrics->m_UPM;
    dVar1 = dVar2 * 0.00390625;
    this->m_normalized_to_font_unit_scale = dVar1;
    if (dVar1 <= 0.0) goto LAB_00473a2e;
    dVar2 = 256.0 / dVar2;
    this->m_font_unit_to_normalized_scale = dVar2;
    if ((0.0 < dVar2) && ((dVar2 != 1.0 || (NAN(dVar2))))) {
      ON_FontMetrics::Scale(&local_48,font_metrics,dVar2);
      goto LAB_00473a5d;
    }
  }
  local_48.m_UPM = font_metrics->m_UPM;
  local_48.m_ascent = font_metrics->m_ascent;
  local_48.m_descent = (this->m_font_unit_metrics).m_descent;
  local_48.m_line_space = (this->m_font_unit_metrics).m_line_space;
  local_48.m_ascent_of_capital = (this->m_font_unit_metrics).m_ascent_of_capital;
  local_48.m_ascent_of_x = (this->m_font_unit_metrics).m_ascent_of_x;
  local_48.m_strikeout_thickness = (this->m_font_unit_metrics).m_strikeout_thickness;
  local_48.m_strikeout_position = (this->m_font_unit_metrics).m_strikeout_position;
  local_48.m_underscore_thickness = (this->m_font_unit_metrics).m_underscore_thickness;
  local_48.m_underscore_position = (this->m_font_unit_metrics).m_underscore_position;
  local_48.m_reserved1 = (this->m_font_unit_metrics).m_reserved1;
  local_48.m_reserved2 = (this->m_font_unit_metrics).m_reserved2;
  local_48.m_reserved3 = (this->m_font_unit_metrics).m_reserved3;
  local_48.m_reserved_ptr = (this->m_font_unit_metrics).m_reserved_ptr;
LAB_00473a5d:
  (this->m_normalized_metrics).m_reserved3 = local_48.m_reserved3;
  (this->m_normalized_metrics).m_reserved_ptr = local_48.m_reserved_ptr;
  (this->m_normalized_metrics).m_underscore_position = local_48.m_underscore_position;
  (this->m_normalized_metrics).m_reserved1 = local_48.m_reserved1;
  (this->m_normalized_metrics).m_reserved2 = local_48.m_reserved2;
  (this->m_normalized_metrics).m_ascent_of_capital = local_48.m_ascent_of_capital;
  (this->m_normalized_metrics).m_ascent_of_x = local_48.m_ascent_of_x;
  (this->m_normalized_metrics).m_strikeout_thickness = local_48.m_strikeout_thickness;
  (this->m_normalized_metrics).m_strikeout_position = local_48.m_strikeout_position;
  (this->m_normalized_metrics).m_underscore_thickness = local_48.m_underscore_thickness;
  (this->m_normalized_metrics).m_UPM = local_48.m_UPM;
  (this->m_normalized_metrics).m_ascent = local_48.m_ascent;
  (this->m_normalized_metrics).m_descent = local_48.m_descent;
  (this->m_normalized_metrics).m_line_space = local_48.m_line_space;
  return;
}

Assistant:

void ON_FontGlyphCache::SetFontMetrics(
  const ON_FontMetrics& font_unit_metrics
)
{
  m_font_unit_metrics = font_unit_metrics;

  m_normalized_to_font_unit_scale 
    = font_unit_metrics.UPM() > 0
    ? (((double)font_unit_metrics.UPM()) / ((double)ON_Font::Constants::AnnotationFontCellHeight))
    : 0.0;
  m_font_unit_to_normalized_scale
    = m_normalized_to_font_unit_scale > 0.0
    ? (((double)ON_Font::Constants::AnnotationFontCellHeight) / ((double)font_unit_metrics.UPM()))
    : 0.0;

  m_normalized_metrics
    = (m_font_unit_to_normalized_scale > 0.0 && 1.0 != m_font_unit_to_normalized_scale)
    ? ON_FontMetrics::Scale(m_font_unit_metrics, m_font_unit_to_normalized_scale)
    : m_font_unit_metrics;
}